

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(Imputer *a,Imputer *b)

{
  double dVar1;
  double dVar2;
  uint32 uVar3;
  void *__n;
  size_t __n_00;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  
  if (a->_oneof_case_[0] != b->_oneof_case_[0]) {
    return false;
  }
  switch(a->_oneof_case_[0]) {
  case 0:
    goto switchD_002e6389_caseD_0;
  case 1:
    if (((a->ImputedValue_).imputeddoublevalue_ == (b->ImputedValue_).imputeddoublevalue_) &&
       (!NAN((a->ImputedValue_).imputeddoublevalue_) && !NAN((b->ImputedValue_).imputeddoublevalue_)
       )) break;
    goto LAB_002e64c5;
  case 2:
    if ((a->ImputedValue_).imputedint64value_ != (b->ImputedValue_).imputedint64value_)
    goto LAB_002e64c5;
    break;
  case 3:
    __n = (((a->ImputedValue_).imputeddoublearray_)->_internal_metadata_).
          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
          .ptr_;
    if ((__n != (((b->ImputedValue_).imputeddoublearray_)->_internal_metadata_).
                super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                .ptr_) ||
       ((__n != (void *)0x0 &&
        (iVar5 = bcmp((((a->ImputedValue_).imputeddoublearray_)->super_MessageLite).
                      _vptr_MessageLite,
                      (((b->ImputedValue_).imputeddoublearray_)->super_MessageLite).
                      _vptr_MessageLite,(size_t)__n), iVar5 != 0)))) goto LAB_002e64c5;
    break;
  case 4:
    bVar4 = vectorsEqual<CoreML::Specification::DoubleVector>
                      ((a->ImputedValue_).imputeddoublearray_,(b->ImputedValue_).imputeddoublearray_
                      );
    goto LAB_002e6410;
  case 5:
    bVar4 = vectorsEqual<CoreML::Specification::Int64Vector>
                      ((a->ImputedValue_).imputedint64array_,(b->ImputedValue_).imputedint64array_);
    goto LAB_002e6410;
  case 6:
    bVar4 = mapsEqual<CoreML::Specification::StringToDoubleMap>
                      ((a->ImputedValue_).imputedstringdictionary_,
                       (b->ImputedValue_).imputedstringdictionary_);
    if (!bVar4) goto LAB_002e64c5;
    goto switchD_002e6389_caseD_0;
  case 7:
    bVar4 = mapsEqual<CoreML::Specification::Int64ToDoubleMap>
                      ((a->ImputedValue_).imputedint64dictionary_,
                       (b->ImputedValue_).imputedint64dictionary_);
LAB_002e6410:
    if (bVar4 != false) break;
    goto LAB_002e64c5;
  }
  uVar3 = a->_oneof_case_[1];
  if (uVar3 == b->_oneof_case_[1]) {
    if (uVar3 == 0xb) {
      dVar1 = (a->ReplaceValue_).replacedoublevalue_;
      dVar2 = (b->ReplaceValue_).replacedoublevalue_;
      if (!NAN(dVar2) || !NAN(dVar1)) {
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_002e64c5;
      }
    }
    else {
      if (uVar3 == 0xc) {
        puVar6 = (undefined8 *)(a->ReplaceValue_).replaceint64value_;
        puVar7 = (undefined8 *)(b->ReplaceValue_).replaceint64value_;
        if (puVar6 != puVar7) goto LAB_002e64c5;
      }
      else {
        if (uVar3 != 0xd) goto switchD_002e6389_caseD_0;
        puVar6 = (undefined8 *)(a->ReplaceValue_).replaceint64value_;
        puVar7 = (undefined8 *)(b->ReplaceValue_).replaceint64value_;
      }
      if (uVar3 != 0xd) {
        puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      }
      __n_00 = puVar6[1];
      if ((__n_00 != puVar7[1]) ||
         ((__n_00 != 0 && (iVar5 = bcmp((void *)*puVar6,(void *)*puVar7,__n_00), iVar5 != 0))))
      goto LAB_002e64c5;
    }
switchD_002e6389_caseD_0:
    bVar4 = true;
  }
  else {
LAB_002e64c5:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline Imputer::ImputedValueCase Imputer::ImputedValue_case() const {
  return Imputer::ImputedValueCase(_oneof_case_[0]);
}